

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_rep_cycles.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
::update_representative_cycles
          (Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
           *this)

{
  uint uVar1;
  bool bVar2;
  Index IVar3;
  Index IVar4;
  Master_chain_matrix *pMVar5;
  Master_chain_matrix *this_00;
  size_type sVar6;
  reference pvVar7;
  ID_index local_6c;
  reference local_68;
  Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *c;
  undefined1 local_50 [8];
  iterator __end0;
  iterator __begin0;
  Column *__range4;
  Cycle cycle;
  Column *col;
  ID_index i;
  Chain_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *this_local;
  
  _i = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->birthToCycle_);
  pMVar5 = _matrix(this);
  IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
          ::get_number_of_columns(pMVar5);
  col._4_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->birthToCycle_,(ulong)IVar3,(value_type_conflict *)((long)&col + 4));
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::clear(&this->representativeCycles_);
  col._0_4_ = 0;
  while( true ) {
    uVar1 = (uint)col;
    pMVar5 = _matrix(this);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
            ::get_number_of_columns(pMVar5);
    if (IVar3 <= uVar1) break;
    pMVar5 = _matrix(this);
    this_00 = _matrix(this);
    IVar3 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
            ::get_column_with_pivot(this_00,(uint)col);
    cycle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                  ::get_column(pMVar5,IVar3);
    bVar2 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
            ::is_paired(&((Column *)
                         cycle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->
                         super_Chain_column_option);
    uVar1 = (uint)col;
    if ((!bVar2) ||
       (IVar4 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                ::get_paired_chain_index
                          ((Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                            *)(cycle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)),
       uVar1 < IVar4)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4);
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
      ::begin((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
               *)&__end0);
      Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
      ::end((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
             *)local_50);
      while (bVar2 = boost::intrusive::operator!=
                               (&__end0,(list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>,_false>
                                         *)local_50), bVar2) {
        local_68 = boost::intrusive::
                   list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>,_false>
                   ::operator*(&__end0);
        local_6c = Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
                   ::get_row_index(local_68);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4,&local_6c);
        boost::intrusive::
        list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>::Matrix_column_tag,_1U>,_false>
        ::operator++(&__end0);
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::push_back(&this->representativeCycles_,(value_type *)&__range4);
      sVar6 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size(&this->representativeCycles_);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->birthToCycle_,(ulong)(uint)col);
      *pvVar7 = (int)sVar6 - 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range4);
    }
    col._0_4_ = (uint)col + 1;
  }
  return;
}

Assistant:

inline void Chain_representative_cycles<Master_matrix>::update_representative_cycles()
{
  birthToCycle_.clear();
  birthToCycle_.resize(_matrix()->get_number_of_columns(), -1);
  representativeCycles_.clear();

  // for birthToCycle_, assumes that @ref PosIdx == @ref IDIdx, ie pivot == birth index... which is not true with
  // vineyards
  // TODO: with vineyard, there is a @ref IDIdx --> @ref PosIdx map stored. somehow get access to it here
  for (typename Master_matrix::ID_index i = 0; i < _matrix()->get_number_of_columns(); i++) {
    auto& col = _matrix()->get_column(_matrix()->get_column_with_pivot(i));
    if (!col.is_paired() || i < col.get_paired_chain_index()) {
      Cycle cycle;
      for (auto& c : col) {
        cycle.push_back(c.get_row_index());
      }
      if constexpr (std::is_same_v<typename Master_matrix::Column, typename Master_matrix::Matrix_heap_column> ||
                    std::is_same_v<typename Master_matrix::Column, typename Master_matrix::Matrix_unordered_set_column>)
        std::sort(cycle.begin(), cycle.end());
      representativeCycles_.push_back(cycle);
      birthToCycle_[i] = representativeCycles_.size() - 1;
    }
  }
}